

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O0

float float_of_substring(substring s)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  char *in_RSI;
  char *in_RDI;
  float f;
  char *endptr;
  char *in_stack_ffffffffffffff98;
  char **in_stack_ffffffffffffffa0;
  allocator *paVar5;
  char *in_stack_ffffffffffffffa8;
  allocator local_41;
  string local_40 [36];
  float local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_RSI;
  local_1c = parseFloat(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
  if (((local_18 == local_10) && (local_10 != local_8)) || (bVar1 = nanpattern(0.0), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"warning: ");
    uVar3 = (long)local_8 - (long)local_10;
    paVar5 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,local_10,uVar3,paVar5);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," is not a good float, replacing with 0");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1c = 0.0;
  }
  return local_1c;
}

Assistant:

inline float float_of_substring(substring s)
{
  char* endptr = s.end;
  float f = parseFloat(s.begin, &endptr);
  if ((endptr == s.begin && s.begin != s.end) || nanpattern(f))
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str()
              << " is not a good float, replacing with 0" << std::endl;
    f = 0;
  }
  return f;
}